

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayof.c
# Opt level: O0

void tommy_arrayof_grow(tommy_arrayof *array,tommy_count_t count)

{
  long lVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  uchar *segment;
  tommy_count_t count_local;
  tommy_arrayof *array_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (array->count < count) {
    array->count = count;
    while (array->bucket_max < count) {
      pvVar2 = lrtr_calloc((ulong)array->bucket_max,array->element_size);
      array->bucket[array->bucket_bit] =
           (void *)((long)pvVar2 - (ulong)array->bucket_max * array->element_size);
      array->bucket_bit = array->bucket_bit + 1;
      array->bucket_max = 1 << ((byte)array->bucket_bit & 0x1f);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_arrayof_grow(tommy_arrayof* array, tommy_count_t count)
{
	if (array->count >= count)
		return;
	array->count = count;

	while (count > array->bucket_max) {
		unsigned char* segment;

		/* allocate one more segment */
		segment = tommy_cast(unsigned char*, tommy_calloc(array->bucket_max, array->element_size));

		/* store it adjusting the offset */
		/* cast to ptrdiff_t to ensure to get a negative value */
		array->bucket[array->bucket_bit] = segment - (tommy_ptrdiff_t)array->bucket_max * array->element_size;

		++array->bucket_bit;
		array->bucket_max = 1 << array->bucket_bit;
	}
}